

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorDatabase::FindAllPackageNames
          (DescriptorDatabase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  bVar1 = (anonymous_namespace)::
          ForAllFileProtos<google::protobuf::DescriptorDatabase::FindAllPackageNames(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)::__0>
                    (in_RDI,in_RSI);
  return bVar1;
}

Assistant:

bool DescriptorDatabase::FindAllPackageNames(std::vector<std::string>* output) {
  return ForAllFileProtos(
      this,
      [](const FileDescriptorProto& file_proto, std::set<std::string>* set) {
        set->insert(file_proto.package());
      },
      output);
}